

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void __thiscall Provider::provideStreamData(Provider *this,int objid,int generation,Pipeline *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 local_21;
  Pipeline *pPStack_20;
  uchar ch;
  Pipeline *p_local;
  int generation_local;
  int objid_local;
  Provider *this_local;
  
  pPStack_20 = p;
  p_local._0_4_ = generation;
  p_local._4_4_ = objid;
  _generation_local = this;
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&this->b);
  uVar1 = Buffer::getBuffer();
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&this->b);
  uVar2 = Buffer::getSize();
  (**(code **)(*(long *)p + 0x10))(p,uVar1,uVar2);
  if ((this->bad_length & 1U) != 0) {
    local_21 = 0x20;
    (**(code **)(*(long *)pPStack_20 + 0x10))(pPStack_20,&local_21,1);
  }
  (**(code **)(*(long *)pPStack_20 + 0x18))();
  return;
}

Assistant:

void
    provideStreamData(int objid, int generation, Pipeline* p) override
    {
        // Don't change signature to use QPDFObjGen const& to detect problems forwarding to legacy
        // implementations.
        p->write(b->getBuffer(), b->getSize());
        if (this->bad_length) {
            unsigned char ch = ' ';
            p->write(&ch, 1);
        }
        p->finish();
    }